

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

FB * __thiscall
amrex::FabArrayBase::getFB
          (FabArrayBase *this,IntVect *nghost,Periodicity *period,bool cross,
          bool enforce_periodicity_only,bool override_sync)

{
  int iVar1;
  uint uVar2;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_> _Var3;
  const_iterator __position;
  FB *unaff_R12;
  bool bVar4;
  IntVect IVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
  pVar6;
  _Alloc_node __an;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*> local_48;
  
  pVar6 = std::
          _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
          ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
                         *)m_TheFBCache,&this->m_bdkey);
  __position._M_node = (_Base_ptr)pVar6.second._M_node;
  _Var3 = pVar6.first._M_node;
  bVar4 = _Var3._M_node == __position._M_node;
  if (!bVar4) {
    do {
      uVar2 = 0;
      switch((this->boxarray).m_bat.m_bat_type) {
      case null:
      case coarsenRatio:
        break;
      case indexType:
      case indexType_coarsenRatio:
        uVar2 = (this->boxarray).m_bat.m_op.m_indexType.m_typ.itype;
        break;
      default:
        uVar2 = (this->boxarray).m_bat.m_op.m_bndryReg.m_typ.itype;
      }
      unaff_R12 = (FB *)_Var3._M_node[1]._M_left;
      if (uVar2 == (unaff_R12->m_typ).itype) {
        IVar5 = BATransformer::coarsen_ratio(&(this->boxarray).m_bat);
        if ((((((unaff_R12->m_crse_ratio).vect[0] == IVar5.vect[0]) &&
              ((unaff_R12->m_crse_ratio).vect[1] == IVar5.vect[1])) &&
             ((unaff_R12->m_crse_ratio).vect[2] == IVar5.vect[2])) &&
            (((unaff_R12 = (FB *)_Var3._M_node[1]._M_left,
              (unaff_R12->m_ngrow).vect[0] == nghost->vect[0] &&
              ((unaff_R12->m_ngrow).vect[1] == nghost->vect[1])) &&
             (((unaff_R12->m_ngrow).vect[2] == nghost->vect[2] &&
              ((unaff_R12->m_cross == cross && (unaff_R12->m_multi_ghost == this->m_multi_ghost)))))
             ))) && ((unaff_R12->m_epo == enforce_periodicity_only &&
                     ((((unaff_R12->m_override_sync == override_sync &&
                        ((unaff_R12->m_period).period.vect[0] == (period->period).vect[0])) &&
                       ((unaff_R12->m_period).period.vect[1] == (period->period).vect[1])) &&
                      ((unaff_R12->m_period).period.vect[2] == (period->period).vect[2])))))) {
          unaff_R12->m_nuse = unaff_R12->m_nuse + 1;
          _DAT_00756eb8 = _DAT_00756eb8 + 1;
          break;
        }
      }
      _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
      bVar4 = _Var3._M_node == __position._M_node;
    } while (!bVar4);
  }
  if (bVar4) {
    unaff_R12 = (FB *)operator_new(0x60);
    FB::FB(unaff_R12,this,nghost,cross,period,enforce_periodicity_only,override_sync,
           this->m_multi_ghost);
    iVar1 = m_FBC_stats + 1;
    if (m_FBC_stats < DAT_00756eac) {
      iVar1 = DAT_00756eac;
    }
    m_FBC_stats = m_FBC_stats + 1;
    unaff_R12->m_nuse = 1;
    _DAT_00756eb8 = _DAT_00756eb8 + 1;
    lRam0000000000756ec0 = lRam0000000000756ec0 + 1;
    local_48.first.m_ba_id.data = (this->m_bdkey).m_ba_id.data;
    local_48.first.m_dm_id.data = (this->m_bdkey).m_dm_id.data;
    __an._M_t = (_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
                 *)m_TheFBCache;
    DAT_00756eac = iVar1;
    local_48.second = unaff_R12;
    std::
    _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>>
    ::
    _M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>,std::_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>>::_Alloc_node>
              ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FB*>>>
                *)m_TheFBCache,__position,&local_48,&__an);
  }
  return unaff_R12;
}

Assistant:

const FabArrayBase::FB&
FabArrayBase::getFB (const IntVect& nghost, const Periodicity& period,
                     bool cross, bool enforce_periodicity_only,
                     bool override_sync) const
{
    BL_PROFILE("FabArrayBase::getFB()");

    BL_ASSERT(getBDKey() == m_bdkey);
    std::pair<FBCacheIter,FBCacheIter> er_it = m_TheFBCache.equal_range(m_bdkey);
    for (FBCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_typ        == boxArray().ixType()      &&
            it->second->m_crse_ratio == boxArray().crseRatio()   &&
            it->second->m_ngrow      == nghost                   &&
            it->second->m_cross      == cross                    &&
            it->second->m_multi_ghost== m_multi_ghost            &&
            it->second->m_epo        == enforce_periodicity_only &&
            it->second->m_override_sync == override_sync         &&
            it->second->m_period     == period              )
        {
            ++(it->second->m_nuse);
            m_FBC_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    FB* new_fb = new FB(*this, nghost, cross, period, enforce_periodicity_only,
                        override_sync, m_multi_ghost);

#ifdef AMREX_MEM_PROFILING
    m_FBC_stats.bytes += new_fb->bytes();
    m_FBC_stats.bytes_hwm = std::max(m_FBC_stats.bytes_hwm, m_FBC_stats.bytes);
#endif

    new_fb->m_nuse = 1;
    m_FBC_stats.recordBuild();
    m_FBC_stats.recordUse();

    m_TheFBCache.insert(er_it.second, FBCache::value_type(m_bdkey,new_fb));

    return *new_fb;
}